

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O3

void absl::lts_20250127::PostSynchEvent(void *obj,int ev)

{
  uint uVar1;
  uint uVar2;
  SynchEvent *e;
  SynchEvent *argument;
  int iVar3;
  char *pcVar4;
  ulong __maxlen;
  ulong uVar5;
  void *pcs [40];
  char buffer [960];
  
  e = GetSynchEvent(obj);
  if ((e == (SynchEvent *)0x0) || (e->log != false)) {
    uVar1 = GetStackTrace(pcs,0x28,1);
    buffer[2] = '\0';
    buffer[0] = ' ';
    buffer[1] = '@';
    if (uVar1 != 0) {
      iVar3 = 2;
      uVar5 = 0;
      do {
        __maxlen = 0x3c0 - (long)iVar3;
        uVar2 = snprintf(buffer + iVar3,__maxlen," %p",pcs[uVar5]);
        if (((int)uVar2 < 0) || (__maxlen <= uVar2)) break;
        iVar3 = iVar3 + uVar2;
        uVar5 = uVar5 + 1;
      } while (uVar1 != uVar5);
    }
    pcVar4 = "";
    if (e != (SynchEvent *)0x0) {
      pcVar4 = e->name;
    }
    raw_log_internal::RawLog
              (kInfo,"mutex.cc",0x1c4,"%s%p %s %s",
               *(undefined8 *)(event_properties + (ulong)(uint)ev * 0x10 + 8),obj,pcVar4,buffer);
  }
  if (((e != (SynchEvent *)0x0) && ((*(uint *)(event_properties + (ulong)(uint)ev * 0x10) & 2) != 0)
      ) && (e->invariant != (_func_void_void_ptr *)0x0)) {
    (*e->invariant)(e->arg);
  }
  UnrefSynchEvent(e);
  return;
}

Assistant:

static void PostSynchEvent(void* obj, int ev) {
  SynchEvent* e = GetSynchEvent(obj);
  // logging is on if event recording is on and either there's no event struct,
  // or it explicitly says to log
  if (e == nullptr || e->log) {
    void* pcs[40];
    int n = absl::GetStackTrace(pcs, ABSL_ARRAYSIZE(pcs), 1);
    // A buffer with enough space for the ASCII for all the PCs, even on a
    // 64-bit machine.
    char buffer[ABSL_ARRAYSIZE(pcs) * 24];
    int pos = snprintf(buffer, sizeof(buffer), " @");
    for (int i = 0; i != n; i++) {
      int b = snprintf(&buffer[pos], sizeof(buffer) - static_cast<size_t>(pos),
                       " %p", pcs[i]);
      if (b < 0 ||
          static_cast<size_t>(b) >= sizeof(buffer) - static_cast<size_t>(pos)) {
        break;
      }
      pos += b;
    }
    ABSL_RAW_LOG(INFO, "%s%p %s %s", event_properties[ev].msg, obj,
                 (e == nullptr ? "" : e->name), buffer);
  }
  const int flags = event_properties[ev].flags;
  if ((flags & SYNCH_F_LCK) != 0 && e != nullptr && e->invariant != nullptr) {
    // Calling the invariant as is causes problems under ThreadSanitizer.
    // We are currently inside of Mutex Lock/Unlock and are ignoring all
    // memory accesses and synchronization. If the invariant transitively
    // synchronizes something else and we ignore the synchronization, we will
    // get false positive race reports later.
    // Reuse EvalConditionAnnotated to properly call into user code.
    struct local {
      static bool pred(SynchEvent* ev) {
        (*ev->invariant)(ev->arg);
        return false;
      }
    };
    Condition cond(&local::pred, e);
    Mutex* mu = static_cast<Mutex*>(obj);
    const bool locking = (flags & SYNCH_F_UNLOCK) == 0;
    const bool trylock = (flags & SYNCH_F_TRY) != 0;
    const bool read_lock = (flags & SYNCH_F_R) != 0;
    EvalConditionAnnotated(&cond, mu, locking, trylock, read_lock);
  }
  UnrefSynchEvent(e);
}